

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.inl
# Opt level: O2

buffer_reader * operator>>(buffer_reader *reader,external_image_data_message *message)

{
  ssize_t sVar1;
  ssize_t sVar2;
  ostream *poVar3;
  runtime_error *this;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  message_header *header_00;
  message_header header;
  string local_1d0 [32];
  stringstream stream;
  ostream local_1a0;
  
  sVar1 = buffer_reader::read(reader,(int)message,in_RDX,in_RCX);
  header_00 = &header;
  operator>>(reader,header_00);
  if (header.id == EXTERNAL_IMAGE_DATA) {
    buffer_reader::operator>>(reader,&message->pixel);
    return reader;
  }
  sVar2 = buffer_reader::read(reader,(int)header_00,__buf,in_RCX);
  buffer_reader::unwind(reader,sVar2 - sVar1);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar3 = std::operator<<(&local_1a0,"Message ids do not match");
  poVar3 = std::operator<<(poVar3," (");
  *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)header.id);
  poVar3 = std::operator<<(poVar3," instead of ");
  *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x43);
  std::operator<<(poVar3,")");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline buffer_reader& operator>>(buffer_reader& reader, T& message)
{
    std::size_t read = reader.read();
    message_header header;
    reader >> header;

    if(header.id != message.id())
    {
        reader.unwind(reader.read() - read);
        std::stringstream stream;
        stream << "Message ids do not match"
               << " (" << std::hex << static_cast<int>(header.id) << " instead of " << std::hex << static_cast<int>(message.id()) << ")";

        throw std::runtime_error(stream.str());
    }

    message.read_body(reader);

    return reader;
}